

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlDate.cpp
# Opt level: O2

filepos_t __thiscall
libebml::EbmlDate::RenderData(EbmlDate *this,IOCallback *output,bool param_2,bool param_3)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  big_int64 b64;
  
  iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])
                    (this,output,CONCAT71(in_register_00000011,param_2),
                     CONCAT71(in_register_00000009,param_3));
  if (CONCAT44(extraout_var,iVar1) != 0) {
    iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
    if (CONCAT44(extraout_var_00,iVar1) != 8) {
      __assert_fail("GetSize() == 8",
                    "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/ebml/src/EbmlDate.cpp"
                    ,0x45,
                    "virtual filepos_t libebml::EbmlDate::RenderData(IOCallback &, bool, bool)");
    }
    b64.platform_value = this->myDate;
    Endian<long,_(libebml::endianess)0>::process_endian(&b64);
    iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
    IOCallback::writeFully(output,&b64.endian_value,CONCAT44(extraout_var_01,iVar1));
  }
  iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
  return CONCAT44(extraout_var_02,iVar1);
}

Assistant:

filepos_t EbmlDate::RenderData(IOCallback & output, bool /* bForceRender */, bool  /* bWithDefault */)
{
  if (GetSize() != 0) {
    assert(GetSize() == 8);
    big_int64 b64(myDate);

    output.writeFully(&b64.endian(),GetSize());
  }

  return GetSize();
}